

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenerators::ParseHeaders
          (cmQtAutoGenerators *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absHeaders,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *includedMocs,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *notIncludedMocs,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  _Rb_tree_node_base *__k;
  bool bVar1;
  const_iterator cVar2;
  ostream *poVar3;
  long *plVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  _Rb_tree_header *p_Var8;
  string macroName;
  string currentMoc;
  string contents;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  _Base_ptr local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_58;
  string local_50;
  
  p_Var6 = (absHeaders->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(absHeaders->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    local_60 = &(includedMocs->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_b0 = &includedMocs->_M_t;
    local_68 = notIncludedMocs;
    local_58 = includedUis;
    do {
      __k = p_Var6 + 1;
      ReadAll(&local_88,*(string **)(p_Var6 + 1));
      if ((this->MocExecutable)._M_string_length != 0) {
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(local_b0,(key_type *)__k);
        if (cVar2._M_node == local_60) {
          if (this->Verbose == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"AUTOGEN: Checking ",0x12);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(p_Var6 + 1),
                                (long)p_Var6[1]._M_parent);
            std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,(string *)__k);
          std::operator+(&local_d0,"moc_",&local_50);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_a8 = &local_98;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_98 = *plVar7;
            lStack_90 = plVar4[3];
          }
          else {
            local_98 = *plVar7;
            local_a8 = (long *)*plVar4;
          }
          local_a0 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          bVar1 = requiresMocing(&local_88,&local_d0);
          if (bVar1) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](local_68,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)pmVar5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8,local_98 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      ParseForUic(this,(string *)__k,&local_88,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  return;
}

Assistant:

void cmQtAutoGenerators::ParseHeaders(const std::set<std::string>& absHeaders,
                const std::map<std::string, std::string>& includedMocs,
                std::map<std::string, std::string>& notIncludedMocs,
                std::map<std::string, std::vector<std::string> >& includedUis)
{
  for(std::set<std::string>::const_iterator hIt=absHeaders.begin();
      hIt!=absHeaders.end();
      ++hIt)
    {
    const std::string& headerName = *hIt;
    const std::string contents = ReadAll(headerName);

    if (!this->MocExecutable.empty()
        && includedMocs.find(headerName) == includedMocs.end())
      {
      if (this->Verbose)
        {
        std::cout << "AUTOGEN: Checking " << headerName << std::endl;
        }

      const std::string basename = cmsys::SystemTools::
                                   GetFilenameWithoutLastExtension(headerName);

      const std::string currentMoc = "moc_" + basename + ".cpp";
      std::string macroName;
      if (requiresMocing(contents, macroName))
        {
        //std::cout << "header contains Q_OBJECT macro";
        notIncludedMocs[headerName] = currentMoc;
        }
      }
    this->ParseForUic(headerName, contents, includedUis);
    }
}